

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_shrink(mbedtls_mpi *X,size_t nblimbs)

{
  ulong n;
  mbedtls_mpi_uint *v;
  ulong uVar1;
  int iVar2;
  mbedtls_mpi_uint *__dest;
  ulong uVar3;
  
  n = X->n;
  uVar1 = n;
  if (n <= nblimbs) {
    iVar2 = mbedtls_mpi_grow(X,nblimbs);
    return iVar2;
  }
  do {
    uVar3 = uVar1;
    if (uVar3 == 1) break;
    uVar1 = uVar3 - 1;
  } while (X->p[uVar3 - 1] == 0);
  if (nblimbs < uVar3) {
    nblimbs = uVar3;
  }
  __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
  if (__dest == (mbedtls_mpi_uint *)0x0) {
    iVar2 = -0x10;
  }
  else {
    v = X->p;
    if (v != (mbedtls_mpi_uint *)0x0) {
      memcpy(__dest,v,nblimbs * 8);
      mbedtls_mpi_zeroize(v,n);
      free(X->p);
    }
    X->n = nblimbs;
    X->p = __dest;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_shrink( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;
    size_t i;

    /* Actually resize up in this case */
    if( X->n <= nblimbs )
        return( mbedtls_mpi_grow( X, nblimbs ) );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;
    i++;

    if( i < nblimbs )
        i = nblimbs;

    if( ( p = (mbedtls_mpi_uint*)mbedtls_calloc( i, ciL ) ) == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->p != NULL )
    {
        memcpy( p, X->p, i * ciL );
        mbedtls_mpi_zeroize( X->p, X->n );
        mbedtls_free( X->p );
    }

    X->n = i;
    X->p = p;

    return( 0 );
}